

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O2

ssize_t __thiscall
Intel::i8255::
i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>::read
          (i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
           *this,int __fd,void *__buf,size_t __nbytes)

{
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *pCVar1;
  byte bVar2;
  uint8_t uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  undefined7 extraout_var;
  byte bVar6;
  undefined7 uVar5;
  
  bVar2 = this->control_;
  uVar5 = (undefined7)((ulong)in_RAX >> 8);
  uVar4 = CONCAT71(uVar5,bVar2);
  switch(__fd & 3) {
  case 0:
    if ((bVar2 & 0x10) != 0) {
      uVar3 = MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler
              ::get_value(this->port_handler_,0);
      return CONCAT71(extraout_var,uVar3);
    }
    uVar4 = CONCAT71(uVar5,this->outputs_[0]);
    break;
  case 1:
    if ((bVar2 & 2) == 0) {
      uVar4 = CONCAT71(uVar5,this->outputs_[1]);
    }
    else {
      pCVar1 = this->port_handler_->machine_;
      uVar4 = CONCAT71((int7)((ulong)pCVar1 >> 8),pCVar1->key_states_[pCVar1->selected_key_line_]);
    }
    break;
  case 2:
    if ((bVar2 & 9) == 0) {
      uVar4 = CONCAT71(uVar5,this->outputs_[2]);
    }
    else {
      bVar2 = MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler
              ::get_value(this->port_handler_,2);
      bVar6 = bVar2;
      if ((this->control_ & 1) == 0) {
        bVar6 = this->outputs_[2];
      }
      if ((this->control_ & 8) == 0) {
        bVar2 = this->outputs_[2];
      }
      uVar4 = (ulong)(bVar2 & 0xf0 | bVar6 & 0xf);
    }
  }
  return uVar4;
}

Assistant:

uint8_t read(int address) {
			switch(address & 3) {
				case 0:	return (control_ & 0x10) ? port_handler_.get_value(0) : outputs_[0];
				case 1:	return (control_ & 0x02) ? port_handler_.get_value(1) : outputs_[1];
				case 2:	{
					if(!(control_ & 0x09)) return outputs_[2];
					uint8_t input = port_handler_.get_value(2);
					return ((control_ & 0x01) ? (input & 0x0f) : (outputs_[2] & 0x0f)) | ((control_ & 0x08) ? (input & 0xf0) : (outputs_[2] & 0xf0));
				}
				case 3:	return control_;
			}
			return 0xff;
		}